

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O0

void __thiscall
Js::JavascriptPromiseResolveThenableTaskFunction::JavascriptPromiseResolveThenableTaskFunction
          (JavascriptPromiseResolveThenableTaskFunction *this,DynamicType *type,
          FunctionInfo *functionInfo,JavascriptPromise *promise,RecyclableObject *thenable,
          RecyclableObject *thenFunction)

{
  RecyclableObject *thenFunction_local;
  RecyclableObject *thenable_local;
  JavascriptPromise *promise_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptPromiseResolveThenableTaskFunction *this_local;
  
  RuntimeFunction::RuntimeFunction(&this->super_RuntimeFunction,type,functionInfo);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e3aef0;
  Memory::WriteBarrierPtr<Js::JavascriptPromise>::WriteBarrierPtr(&this->promise,promise);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->thenable,thenable);
  Memory::WriteBarrierPtr<Js::RecyclableObject>::WriteBarrierPtr(&this->thenFunction,thenFunction);
  return;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction(DynamicType* type, FunctionInfo* functionInfo, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
            : RuntimeFunction(type, functionInfo), promise(promise), thenable(thenable), thenFunction(thenFunction)
        { }